

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void output_with_header(string *filename,string *header)

{
  ostream *poVar1;
  ifstream f;
  streambuf local_200 [504];
  
  std::ifstream::ifstream(&f,(string *)filename,_S_in);
  poVar1 = std::operator<<((ostream *)&std::cout,"----- ");
  poVar1 = std::operator<<(poVar1,(string *)header);
  poVar1 = std::operator<<(poVar1," -----");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_200);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1060f0);
  poVar1 = std::operator<<((ostream *)&std::cout,"-----------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ifstream::~ifstream(&f);
  return;
}

Assistant:

void output_with_header(const std::string& filename, const std::string& header) {
    std::ifstream f(filename);
    // Clear is needed if the file is empty.
    std::cout << "----- " << header << " -----" << std::endl;
    std::cout << f.rdbuf() << std::endl;
    std::cout.clear();
    std::cout << "-----------------" << std::endl;
}